

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Distribution(int g_a,int iproc,int *lo,int *hi)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer p;
  Integer a;
  Integer in_stack_00000140;
  Integer *in_stack_00000258;
  Integer *in_stack_00000260;
  Integer in_stack_00000268;
  Integer in_stack_00000270;
  int local_b0;
  int local_ac;
  undefined8 local_a8 [8];
  undefined8 local_68 [7];
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_28 = (long)in_ESI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_30 = pnga_ndim(in_stack_00000140);
  pnga_distribution(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  for (local_ac = 0; local_ac < local_30; local_ac = local_ac + 1) {
    *(int *)(local_10 + ((local_30 - local_ac) + -1) * 4) = (int)local_68[local_ac] + -1;
  }
  for (local_b0 = 0; local_b0 < local_30; local_b0 = local_b0 + 1) {
    *(int *)(local_18 + ((local_30 - local_b0) + -1) * 4) = (int)local_a8[local_b0] + -1;
  }
  return;
}

Assistant:

void NGA_Distribution(int g_a, int iproc, int lo[], int hi[])
{
     Integer a=(Integer)g_a;
     Integer p=(Integer)iproc;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     wnga_distribution(a, p, _ga_lo, _ga_hi);
     COPYINDEX_F2C(_ga_lo,lo, ndim);
     COPYINDEX_F2C(_ga_hi,hi, ndim);
}